

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O3

size_t __thiscall ON_RTreeMemPool::SizeOfUnusedBuffer(ON_RTreeMemPool *this)

{
  size_t sVar1;
  ON_RTreeMemPool *pOVar2;
  Blk **ppBVar3;
  
  sVar1 = this->m_buffer_capacity - 0x168;
  pOVar2 = this;
  do {
    pOVar2 = (ON_RTreeMemPool *)pOVar2->m_nodes;
    sVar1 = sVar1 + 0x158;
  } while (pOVar2 != (ON_RTreeMemPool *)0x0);
  ppBVar3 = &this->m_list_nodes;
  do {
    ppBVar3 = &(*ppBVar3)->m_next;
    sVar1 = sVar1 + 0x10;
  } while (ppBVar3 != (Blk **)0x0);
  return sVar1;
}

Assistant:

size_t ON_RTreeMemPool::SizeOfUnusedBuffer() const
{
  const struct Blk* blk;
  size_t sz = m_buffer_capacity;
  for ( blk = m_nodes; blk; blk = blk->m_next )
  {
    sz += sizeof(struct ON_RTreeNode);
  }
  for ( blk = m_list_nodes; blk; blk = blk->m_next )
  {
    sz += sizeof(struct ON_RTreeListNode);
  }
  return sz;
}